

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5IndexFlush(Fts5Index *p)

{
  int *pRc;
  int iVar1;
  int iVar2;
  Fts5Hash *p_00;
  Fts5StructureSegment *pFVar3;
  u64 uVar4;
  bool bVar5;
  u8 *puVar6;
  int nTerm_00;
  char *pTerm;
  uint uVar7;
  Fts5Structure *pFVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  Fts5Config *pFVar13;
  long lVar14;
  int iVar15;
  int *piVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  int *in_R8;
  Fts5Structure *pStruct;
  long lVar20;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  long in_FS_OFFSET;
  int local_174;
  int *local_158;
  Fts5Structure *local_148;
  int local_f8;
  int bDel;
  u64 iDelta;
  int local_e4;
  u8 *pDoclist;
  int nTerm;
  char *zTerm;
  Fts5SegWriter writer;
  int pgnoLast;
  Fts5Structure *local_48;
  u32 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (p->flushRc != 0) {
    p->rc = p->flushRc;
    goto LAB_001c9295;
  }
  if ((p->nPendingData == 0) && (p->nContentlessDelete == 0)) goto LAB_001c9295;
  p_00 = p->pHash;
  pgnoLast = 0;
  local_148 = fts5StructureRead(p);
  local_48 = local_148;
  fts5StructureInvalidate(p);
  iVar18 = 0;
  if ((p_00->nEntry != 0) && (iVar10 = fts5AllocateSegid(p,local_148), iVar18 = 0, iVar10 != 0)) {
    pFVar13 = p->pConfig;
    iVar18 = pFVar13->eDetail;
    iVar1 = pFVar13->pgsz;
    iVar2 = pFVar13->bSecureDelete;
    writer._112_8_ = &DAT_aaaaaaaaaaaaaaaa;
    writer.btterm.p = &DAT_aaaaaaaaaaaaaaaa;
    writer.btterm._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    writer._80_8_ = &DAT_aaaaaaaaaaaaaaaa;
    writer.aDlidx = (Fts5DlidxWriter *)&DAT_aaaaaaaaaaaaaaaa;
    writer.iPrevRowid = (i64)&DAT_aaaaaaaaaaaaaaaa;
    writer._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
    writer.writer.term.p = &DAT_aaaaaaaaaaaaaaaa;
    writer.writer.term._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    writer.writer.pgidx.p = &DAT_aaaaaaaaaaaaaaaa;
    writer.writer.pgidx._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    writer.writer.buf.p = &DAT_aaaaaaaaaaaaaaaa;
    writer.writer.buf._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    writer._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    writer.writer._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    fts5WriteInit(p,&writer,iVar10);
    pRc = &p->rc;
    iVar11 = p->rc;
    if (iVar11 == 0) {
      iVar11 = sqlite3Fts5HashScanInit(p_00,(char *)0x0,0);
      *pRc = iVar11;
    }
LAB_001c8acd:
    iVar15 = (int)in_R8;
    if ((iVar11 != 0) || (p_00->pScan == (Fts5HashEntry *)0x0)) goto LAB_001c906a;
    zTerm = &DAT_aaaaaaaaaaaaaaaa;
    nTerm = -0x55555556;
    pDoclist = &DAT_aaaaaaaaaaaaaaaa;
    local_e4 = -0x55555556;
    in_R8 = &local_e4;
    sqlite3Fts5HashScanEntry(p_00,&zTerm,&nTerm,&pDoclist,in_R8);
    pTerm = zTerm;
    nTerm_00 = nTerm;
    if (iVar2 == 0) {
      fts5WriteAppendTerm(p,&writer,nTerm,(u8 *)zTerm);
      iVar11 = local_e4;
      iVar15 = (int)in_R8;
      if (p->rc != 0) goto LAB_001c906a;
      if (writer.writer.pgidx.n + writer.writer.buf.n + local_e4 < iVar1) {
        memcpy(writer.writer.buf.p + writer.writer.buf.n,pDoclist,(long)local_e4);
        writer.writer.buf.n = writer.writer.buf.n + iVar11;
        iVar11 = *pRc;
LAB_001c8bda:
        if (iVar11 == 0) {
          p_00->pScan = p_00->pScan->pScanNext;
          iVar11 = 0;
        }
        goto LAB_001c8acd;
      }
    }
    puVar6 = pDoclist;
    local_158 = (int *)0x0;
    uVar21 = 0;
    piVar16 = (int *)0x0;
    local_174 = local_e4;
    bVar5 = iVar2 == 0;
LAB_001c8c26:
    iVar11 = *pRc;
    if ((iVar11 != 0) || (iVar15 = (int)uVar21, local_174 <= iVar15)) goto LAB_001c8bda;
    iDelta = 0;
    bVar9 = sqlite3Fts5GetVarint(puVar6 + iVar15,&iDelta);
    uVar23 = (uint)bVar9 + iVar15;
    local_158 = (int *)((long)local_158 + iDelta);
    if (iVar2 != 0) {
      lVar20 = (long)(int)uVar23;
      if (iVar18 != 1) {
        if ((((puVar6[lVar20] & 1) == 0) ||
            (in_R8 = local_158,
            iVar11 = fts5FlushSecureDelete(p,local_148,pTerm,nTerm_00,(i64)local_158), iVar11 != 0))
           || ((*pRc == 0 && (puVar6[lVar20] != '\x01')))) goto LAB_001c8d15;
        uVar21 = (ulong)(uVar23 + 1);
        goto LAB_001c8c26;
      }
      if ((((int)uVar23 < local_174) && (puVar6[lVar20] == '\0')) &&
         (in_R8 = local_158,
         iVar11 = fts5FlushSecureDelete(p,local_148,pTerm,nTerm_00,(i64)local_158), iVar11 == 0)) {
        uVar21 = lVar20 + 1;
        if (((int)uVar21 < local_174) && (puVar6[uVar21] == '\0')) {
          uVar23 = uVar23 + 2;
          local_174 = 0;
          goto LAB_001c8d15;
        }
        goto LAB_001c8c26;
      }
    }
LAB_001c8d15:
    if (*pRc == 0 && !bVar5) {
      fts5WriteAppendTerm(p,&writer,nTerm_00,(u8 *)pTerm);
      bVar5 = true;
    }
    iVar11 = writer.writer.buf.n;
    if (writer.bFirstRowidInPage == '\0') {
      iVar11 = sqlite3Fts5PutVarint
                         (writer.writer.buf.p + writer.writer.buf.n,(long)local_158 - (long)piVar16)
      ;
      writer.writer.buf.n = writer.writer.buf.n + iVar11;
    }
    else {
      *(ushort *)writer.writer.buf.p =
           (ushort)writer.writer.buf.n << 8 | (ushort)writer.writer.buf.n >> 8;
      iVar11 = sqlite3Fts5PutVarint(writer.writer.buf.p + iVar11,(u64)local_158);
      writer.writer.buf.n = writer.writer.buf.n + iVar11;
      writer.bFirstRowidInPage = '\0';
      fts5WriteDlidxAppend(p,&writer,(i64)local_158);
    }
    iVar11 = *pRc;
    if (iVar11 != 0) goto LAB_001c8acd;
    lVar20 = (long)(int)uVar23;
    piVar16 = local_158;
    if (iVar18 == 1) {
      if (((int)uVar23 < local_174) && (puVar6[lVar20] == '\0')) {
        iVar11 = writer.writer.buf.n;
        lVar14 = (long)writer.writer.buf.n;
        iVar15 = writer.writer.buf.n + 1;
        writer.writer.buf.n = iVar15;
        writer.writer.buf.p[lVar14] = '\0';
        uVar21 = lVar20 + 1;
        if (((int)uVar21 < local_174) && (puVar6[uVar21] == '\0')) {
          writer.writer.buf.n = iVar11 + 2;
          writer.writer.buf.p[iVar15] = '\0';
          uVar23 = uVar23 + 2;
          goto LAB_001c8dfc;
        }
      }
      else {
LAB_001c8dfc:
        uVar21 = (ulong)uVar23;
      }
      if (iVar1 <= writer.writer.pgidx.n + writer.writer.buf.n) {
        fts5WriteFlushLeaf(p,&writer);
      }
    }
    else {
      bDel = 0;
      local_f8 = 0;
      iVar15 = fts5GetPoslistSize(puVar6 + lVar20,&local_f8,&bDel);
      iVar11 = local_f8;
      if ((iVar2 == 0) || (bDel == 0)) {
        iVar11 = local_f8 + iVar15;
      }
      else {
        sqlite3Fts5BufferAppendVarint(pRc,&writer.writer.buf,(long)local_f8 * 2);
        uVar23 = uVar23 + iVar15;
      }
      if (iVar1 < writer.writer.buf.n + iVar11 + writer.writer.pgidx.n) {
        iVar15 = 0;
        do {
          if (*pRc != 0) break;
          lVar20 = (long)writer.writer.buf.n;
          iVar22 = iVar1 - (writer.writer.pgidx.n + writer.writer.buf.n);
          uVar17 = iVar11 - iVar15;
          if (iVar22 < (int)uVar17) {
            uVar17 = sqlite3Fts5GetVarint32(puVar6 + (long)iVar15 + (long)(int)uVar23,&local_3c);
            if ((int)uVar17 < iVar22) {
              uVar7 = uVar17;
              do {
                uVar17 = uVar7;
                iVar12 = sqlite3Fts5GetVarint32
                                   (puVar6 + (long)iVar15 + (long)(int)uVar23 + uVar17,&local_3c);
                uVar7 = iVar12 + uVar17;
              } while ((int)(iVar12 + uVar17) <= iVar22);
            }
          }
          memcpy(writer.writer.buf.p + lVar20,puVar6 + (long)iVar15 + (long)(int)uVar23,
                 (long)(int)uVar17);
          iVar22 = uVar17 + writer.writer.buf.n;
          writer.writer.buf.n = iVar22;
          if (iVar1 <= iVar22 + writer.writer.pgidx.n) {
            fts5WriteFlushLeaf(p,&writer);
          }
          iVar15 = iVar15 + uVar17;
        } while (iVar15 < iVar11);
      }
      else {
        memcpy(writer.writer.buf.p + writer.writer.buf.n,puVar6 + (int)uVar23,(long)iVar11);
        writer.writer.buf.n = writer.writer.buf.n + iVar11;
      }
      uVar21 = (ulong)(iVar11 + uVar23);
    }
    goto LAB_001c8c26;
  }
  goto LAB_001c9133;
LAB_001c906a:
  fts5WriteFinish(p,&writer,&pgnoLast);
  iVar18 = pgnoLast;
  if (0 < pgnoLast) {
    if (local_148->nLevel == 0) {
      fts5StructureAddLevel(pRc,&local_48);
      local_148 = local_48;
    }
    fts5StructureExtendLevel(pRc,local_148,0,0,iVar15);
    if (*pRc == 0) {
      pFVar3 = local_148->aLevel[0].aSeg;
      iVar1 = local_148->aLevel[0].nSeg;
      local_148->aLevel[0].nSeg = iVar1 + 1;
      pFVar3[iVar1].iSegid = iVar10;
      pFVar3[iVar1].pgnoFirst = 1;
      pFVar3[iVar1].pgnoLast = iVar18;
      uVar4 = local_148->nOriginCntr;
      if (uVar4 != 0) {
        pFVar3[iVar1].iOrigin1 = uVar4;
        pFVar3[iVar1].iOrigin2 = uVar4;
        pFVar3[iVar1].nEntry = (long)p->nPendingRow;
        local_148->nOriginCntr = uVar4 + 1;
      }
      local_148->nSegment = local_148->nSegment + 1;
    }
    fts5StructurePromote(p,0,local_148);
  }
LAB_001c9133:
  pFVar13 = p->pConfig;
  if ((p->rc == 0) && (iVar10 = pFVar13->nAutomerge, 0 < iVar10)) {
    if (local_148 != (Fts5Structure *)0x0) {
      uVar21 = local_148->nWriteCounter;
      uVar19 = (long)iVar18 + (long)p->nContentlessDelete + uVar21;
      iVar18 = p->nWorkUnit;
      local_148->nWriteCounter = uVar19;
      fts5IndexMerge(p,&local_48,
                     ((int)(uVar19 / (ulong)(long)iVar18) - (int)(uVar21 / (ulong)(long)iVar18)) *
                     iVar18 * local_148->nLevel,iVar10);
      local_148 = local_48;
      pFVar13 = p->pConfig;
      goto LAB_001c913f;
    }
LAB_001c923a:
    local_148 = (Fts5Structure *)0x0;
    pFVar8 = local_48;
  }
  else {
LAB_001c913f:
    iVar18 = pFVar13->nCrisisMerge;
    writer._0_8_ = local_148;
    if (local_148 == (Fts5Structure *)0x0) goto LAB_001c923a;
    pFVar8 = local_48;
    if (0 < local_148->nLevel) {
      iVar10 = 1;
      for (lVar20 = 0x24;
          (pFVar8 = local_148, p->rc == 0 &&
          (pFVar8 = local_148,
          iVar18 <= *(int *)((long)&((Fts5Structure *)(local_148->aLevel + -2))->nRef + lVar20)));
          lVar20 = lVar20 + 0x10) {
        fts5IndexMergeLevel(p,(Fts5Structure **)&writer,iVar10 + -1,(int *)0x0);
        local_148 = (Fts5Structure *)writer._0_8_;
        fts5StructurePromote(p,iVar10,(Fts5Structure *)writer._0_8_);
        iVar10 = iVar10 + 1;
      }
    }
  }
  local_48 = pFVar8;
  fts5StructureWrite(p,local_148);
  fts5StructureRelease(local_148);
  if (p->rc == 0) {
    sqlite3Fts5HashClear(p->pHash);
    p->nPendingData = 0;
    p->nContentlessDelete = 0;
    p->nPendingRow = 0;
  }
  else if ((p->nPendingData != 0) || (p->nContentlessDelete != 0)) {
    p->flushRc = p->rc;
  }
LAB_001c9295:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fts5IndexFlush(Fts5Index *p){
  /* Unless it is empty, flush the hash table to disk */
  if( p->flushRc ){
    p->rc = p->flushRc;
    return;
  }
  if( p->nPendingData || p->nContentlessDelete ){
    assert( p->pHash );
    fts5FlushOneHash(p);
    if( p->rc==SQLITE_OK ){
      sqlite3Fts5HashClear(p->pHash);
      p->nPendingData = 0;
      p->nPendingRow = 0;
      p->nContentlessDelete = 0;
    }else if( p->nPendingData || p->nContentlessDelete ){
      p->flushRc = p->rc;
    }
  }
}